

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

void __thiscall QColumnView::scrollContentsBy(QColumnView *this,int dx,int dy)

{
  long lVar1;
  QWidget *this_00;
  LayoutDirection LVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long in_FS_OFFSET;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((dx != 0) &&
     (lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                        super_QWidget.field_0x8, *(long *)(lVar1 + 0x550) != 0)) {
    LVar2 = QWidget::layoutDirection((QWidget *)this);
    iVar5 = -dx;
    if (LVar2 != RightToLeft) {
      iVar5 = dx;
    }
    if (*(long *)(lVar1 + 0x550) != 0) {
      uVar4 = 0;
      do {
        this_00 = *(QWidget **)(*(long *)(lVar1 + 0x548) + uVar4 * 8);
        iVar3 = QWidget::x(this_00);
        local_40.xp.m_i = iVar3 + iVar5;
        local_40.yp.m_i = 0;
        QWidget::move(this_00,&local_40);
        uVar4 = uVar4 + 1;
      } while (uVar4 < *(ulong *)(lVar1 + 0x550));
    }
    *(int *)(lVar1 + 0x574) = *(int *)(lVar1 + 0x574) + iVar5;
    QAbstractScrollArea::scrollContentsBy((QAbstractScrollArea *)this,iVar5,dy);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnView::scrollContentsBy(int dx, int dy)
{
    Q_D(QColumnView);
    if (d->columns.isEmpty() || dx == 0)
        return;

    dx = isRightToLeft() ? -dx : dx;
    for (int i = 0; i < d->columns.size(); ++i)
        d->columns.at(i)->move(d->columns.at(i)->x() + dx, 0);
    d->offset += dx;
    QAbstractItemView::scrollContentsBy(dx, dy);
}